

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O3

bool __thiscall jbcoin::base_uint<128UL,_void>::SetHexExact(base_uint<128UL,_void> *this,char *psz)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while ((iVar1 = charUnHex(psz[lVar3 * 2]), iVar1 != -1 &&
         (iVar2 = charUnHex(psz[lVar3 * 2 + 1]), iVar2 != -1))) {
    *(byte *)((long)this->pn + lVar3) = (byte)iVar2 | (byte)(iVar1 << 4);
    lVar3 = lVar3 + 1;
    if ((int)lVar3 == 0x10) {
      return psz[lVar3 * 2] == '\0';
    }
  }
  return false;
}

Assistant:

bool SetHexExact (const char* psz)
    {
        unsigned char* pOut  = begin ();

        assert(sizeof(pn) == bytes);
        for (int i = 0; i < sizeof (pn); ++i)
        {
            auto hi = charUnHex(*psz++);
            if (hi == -1)
                return false;

            auto lo = charUnHex (*psz++);
            if (lo == -1)
                return false;

            *pOut++ = (hi << 4) | lo;
        }

        // We've consumed exactly as many bytes as we needed at this point
        // so we should be at the end of the string.
        return (*psz == 0);
    }